

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_chainstate_tests.cpp
# Opt level: O2

void __thiscall
validation_chainstate_tests::chainstate_update_tip::test_method(chainstate_update_tip *this)

{
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *val;
  ChainstateManager *this_00;
  pointer ppCVar1;
  pointer ppCVar2;
  string_view source_file;
  path leveldb_name;
  element_type *block;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar6;
  Chainstate *pCVar7;
  Logger *pLVar8;
  CCoinsViewCache *this_01;
  Chainstate *pCVar9;
  Chainstate **ppCVar10;
  CChainParams *consensusParams;
  runtime_error *this_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var11;
  CBlockIndex *pCVar12;
  char *pcVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  iterator pvVar14;
  iterator in_R9;
  iterator pvVar15;
  BlockValidationState *pBVar16;
  CBlockIndex *pCVar17;
  long *plVar18;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  string_view str;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  shared_ptr<const_CBlock> pblock;
  shared_ptr<const_CBlock> pblock_00;
  string_view logging_function;
  undefined4 uVar19;
  undefined4 uVar20;
  check_type in_stack_fffffffffffffaf0;
  check_type cVar21;
  undefined4 in_stack_fffffffffffffaf4;
  path *ppVar22;
  undefined8 in_stack_fffffffffffffaf8;
  undefined4 in_stack_fffffffffffffb00;
  undefined1 in_stack_fffffffffffffb04 [12];
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  undefined1 local_450 [16];
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  pointer local_400;
  pointer local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  assertion_result local_340;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  shared_ptr<CBlock> pblockone;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 local_2c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2c0;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_2b8;
  AutoFile local_2a0;
  int height;
  uint256 curr_tip;
  BlockValidationState state_1;
  bool newblock;
  undefined7 uStack_20f;
  size_type local_208;
  BlockValidationState state;
  undefined1 local_188 [32];
  string local_168;
  UniValue result;
  CBlockIndex *pindex;
  path snapshot_path;
  path root;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock10;
  AutoFile local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  val = &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
         super_BasicTestingSetup.m_node.chainman;
  pcVar13 = "m_node.chainman";
  puVar6 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (val,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
                      ,0x47,"test_method","m_node.chainman");
  this_00 = (puVar6->_M_t).
            super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
            super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
            super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl;
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x10] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x10];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x11] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x11];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x12] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x12];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x13] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x13];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x14] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x14];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x15] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x15];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x16] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x16];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x17] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x17];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x18] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x18];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x19] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x19];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x1a] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x1a];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x1b] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x1b];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x1c] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x1c];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x1d] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x1d];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x1e] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x1e];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0x1f] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0x1f];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0];
  curr_tip.super_base_blob<256U>.m_data._M_elems[1] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[1];
  curr_tip.super_base_blob<256U>.m_data._M_elems[2] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[2];
  curr_tip.super_base_blob<256U>.m_data._M_elems[3] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[3];
  curr_tip.super_base_blob<256U>.m_data._M_elems[4] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[4];
  curr_tip.super_base_blob<256U>.m_data._M_elems[5] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[5];
  curr_tip.super_base_blob<256U>.m_data._M_elems[6] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[6];
  curr_tip.super_base_blob<256U>.m_data._M_elems[7] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[7];
  curr_tip.super_base_blob<256U>.m_data._M_elems[8] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[8];
  curr_tip.super_base_blob<256U>.m_data._M_elems[9] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[9];
  curr_tip.super_base_blob<256U>.m_data._M_elems[10] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[10];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0xb] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0xb];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0xc] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0xc];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0xd] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0xd];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0xe] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0xe];
  curr_tip.super_base_blob<256U>.m_data._M_elems[0xf] =
       g_best_block.super_base_blob<256U>.m_data._M_elems[0xf];
  TestChain100Setup::mineBlocks(&this->super_TestChain100Setup,10);
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x4f;
  file.m_begin = (iterator)&local_2d8;
  msg.m_end = in_R9;
  msg.m_begin = pcVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2e8,msg);
  bVar4 = ::operator!=(&g_best_block.super_base_blob<256U>,&curr_tip.super_base_blob<256U>);
  result.typ._0_1_ = bVar4;
  result.val._M_dataplus._M_p = (pointer)0x0;
  result.val._M_string_length = 0;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity =
       (size_type)&state_1;
  state_1.super_ValidationState<BlockValidationResult>._0_8_ = anon_var_dwarf_14c9f29;
  state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p = "";
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
       0xffffffffffffff00;
  state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_011481f0;
  state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_2f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
  ;
  local_2f0 = "";
  uVar19 = 0;
  uVar20 = 0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&result,(lazy_ostream *)&state,1,0,WARN,
             CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),(size_t)&local_2f8,0x4f);
  boost::detail::shared_count::~shared_count((shared_count *)&result.val._M_string_length);
  std::make_shared<CBlock>();
  pvVar14 = (iterator)0x54;
  pvVar15 = (iterator)0x0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&state,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
             ,0x54,false);
  block = pblockone.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pCVar7 = ChainstateManager::ActiveChainstate(this_00);
  ::node::BlockManager::ReadBlockFromDisk
            (&this_00->m_blockman,block,
             (pCVar7->m_chain).vChain.
             super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
             super__Vector_impl_data._M_start[1]);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&state);
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x59;
  file_00.m_begin = (iterator)&local_318;
  msg_00.m_end = pvVar15;
  msg_00.m_begin = pvVar14;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_328,
             msg_00);
  std::filesystem::__cxx11::path::path
            (&root.super_path,
             &(this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
              super_BasicTestingSetup.m_path_root.super_path);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&state,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/chainstate.h"
             ,0x2d,false);
  height = ChainstateManager::ActiveHeight
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&state);
  std::filesystem::__cxx11::path::path((path *)&pindex,&root.super_path);
  tinyformat::format<int>((string *)&newblock,"test_snapshot.%d.dat",&height);
  state_1.super_ValidationState<BlockValidationResult>._0_8_ =
       &state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length;
  std::__cxx11::u8string::
  _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((u8string *)&state_1,CONCAT71(uStack_20f,newblock),
             local_208 + CONCAT71(uStack_20f,newblock));
  std::filesystem::__cxx11::path::path<std::__cxx11::u8string,std::filesystem::__cxx11::path>
            ((path *)&state,
             (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *)&state_1,
             auto_format);
  std::filesystem::__cxx11::path::path((path *)&result,(path *)&state);
  std::filesystem::__cxx11::path::~path((path *)&state);
  std::__cxx11::u8string::~u8string((u8string *)&state_1);
  std::filesystem::__cxx11::path::operator/=((path *)&pindex,(path *)&result);
  std::filesystem::__cxx11::path::path(&snapshot_path.super_path,(path *)&pindex);
  std::filesystem::__cxx11::path::~path((path *)&result);
  std::__cxx11::string::~string((string *)&newblock);
  std::filesystem::__cxx11::path::~path((path *)&pindex);
  local_2a0.m_file = (FILE *)fsbridge::fopen((char *)&snapshot_path.super_path,"wb");
  local_2a0.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2a0.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2a0.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_2b8);
  pCVar7 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&snapshot_path;
  CreateUTXOSnapshot(&result,&(this->super_TestChain100Setup).super_TestingSetup.
                              super_ChainTestingSetup.super_BasicTestingSetup.m_node,pCVar7,
                     &local_2a0,(path *)args_1,(path *)args_1);
  std::filesystem::__cxx11::path::string(&local_168,&snapshot_path.super_path);
  UniValue::write_abi_cxx11_((UniValue *)local_188,(int)&result,(void *)0x0,0);
  pLVar8 = LogInstance();
  bVar4 = BCLog::Logger::Enabled(pLVar8);
  if (bVar4) {
    state.super_ValidationState<BlockValidationResult>._0_8_ =
         &state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)0x0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
         state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length &
         0xffffffffffffff00;
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              ((string *)&state_1,(tinyformat *)"Wrote UTXO snapshot to %s: %s\n",(char *)&local_168
               ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188,
               args_1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&state,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&state_1);
    std::__cxx11::string::~string((string *)&state_1);
    pLVar8 = LogInstance();
    state_1.super_ValidationState<BlockValidationResult>.m_mode = 0x5f;
    state_1.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/chainstate.h"
    ;
    uVar19 = 0x5f;
    uVar20 = 0;
    in_stack_fffffffffffffaf0 = 0xc88b01;
    in_stack_fffffffffffffaf4 = 0;
    in_stack_fffffffffffffb00 = 2;
    in_stack_fffffffffffffaf8 = 0xffffffffffffffff;
    source_file._M_str._0_4_ = 0xc88b01;
    source_file._M_len = 0x5f;
    source_file._M_str._4_4_ = 0;
    str._M_str = (char *)state.super_ValidationState<BlockValidationResult>._0_8_;
    str._M_len = (size_t)state.super_ValidationState<BlockValidationResult>.m_reject_reason.
                         _M_dataplus._M_p;
    logging_function._M_str = "CreateAndActivateUTXOSnapshot";
    logging_function._M_len = 0x1d;
    BCLog::Logger::LogPrintStr(pLVar8,str,logging_function,source_file,0x35,ALL,Info);
    std::__cxx11::string::~string((string *)&state);
  }
  std::__cxx11::string::~string((string *)local_188);
  std::__cxx11::string::~string((string *)&local_168);
  local_58.m_file = (FILE *)fsbridge::fopen((char *)&snapshot_path,"rb");
  local_58.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188._0_8_ = (pointer)0x0;
  local_188._8_8_ = (pointer)0x0;
  local_188._16_8_ = 0;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)local_188);
  ::node::SnapshotMetadata::SnapshotMetadata
            ((SnapshotMetadata *)&state,
             (MessageStartChars)
             *&(((((val->_M_t).
                   super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                   .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_options).
                chainparams)->pchMessageStart)._M_elems);
  ::node::SnapshotMetadata::Unserialize<AutoFile>((SnapshotMetadata *)&state,&local_58);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock10,&cs_main,"::cs_main",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/chainstate.h"
             ,0x49,false);
  pCVar7 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar1 = (pCVar7->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar1 ==
      (pCVar7->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar17 = (CBlockIndex *)0x0;
  }
  else {
    pCVar17 = ppCVar1[-1];
  }
  pCVar7 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  CBlockIndex::GetBlockHash
            ((uint256 *)&state_1,
             *(pCVar7->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_start);
  ChainstateManager::ResetChainstates
            ((val->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ChainstateManager::InitializeChainstate
            ((this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.chainman._M_t.
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,
             (this->super_TestChain100Setup).super_TestingSetup.super_ChainTestingSetup.
             super_BasicTestingSetup.m_node.mempool._M_t.
             super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
             super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
             super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
  pCVar7 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  newblock = Chainstate::LoadGenesisBlock(pCVar7);
  inline_assertion_check<true,bool>
            (&newblock,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/chainstate.h"
             ,0x4f,"CreateAndActivateUTXOSnapshot","chain.LoadGenesisBlock()");
  fs::path::path((path *)&newblock,"");
  leveldb_name.super_path._M_pathname._M_dataplus._M_p._4_4_ = uVar20;
  leveldb_name.super_path._M_pathname._M_dataplus._M_p._0_4_ = uVar19;
  leveldb_name.super_path._M_pathname._M_string_length._0_4_ = in_stack_fffffffffffffaf0;
  leveldb_name.super_path._M_pathname._M_string_length._4_4_ = in_stack_fffffffffffffaf4;
  leveldb_name.super_path._M_pathname.field_2._M_allocated_capacity = in_stack_fffffffffffffaf8;
  leveldb_name.super_path._M_pathname.field_2._8_4_ = in_stack_fffffffffffffb00;
  leveldb_name.super_path._28_12_ = in_stack_fffffffffffffb04;
  Chainstate::InitCoinsDB(pCVar7,0x100000,true,false,leveldb_name);
  std::filesystem::__cxx11::path::~path((path *)&newblock);
  Chainstate::InitCoinsCache(pCVar7,0x100000);
  this_01 = Chainstate::CoinsTip(pCVar7);
  CCoinsViewCache::SetBestBlock(this_01,(uint256 *)&state_1);
  local_168._M_dataplus._M_p =
       (pointer)::node::BlockManager::LookupBlockIndex
                          (&((val->_M_t).
                             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                             .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->
                            m_blockman,(uint256 *)&state_1);
  std::
  _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
  ::_M_insert_unique<CBlockIndex*>
            ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,node::CBlockIndexWorkComparator,std::allocator<CBlockIndex*>>
              *)&pCVar7->setBlockIndexCandidates,(CBlockIndex **)&local_168);
  Chainstate::LoadChainTip(pCVar7);
  ChainstateManager::MaybeRebalanceCaches
            ((val->_M_t).
             super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>._M_t.
             super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
             super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar1 = (pCVar7->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar2 = (pCVar7->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (; pCVar17 != (CBlockIndex *)0x0; pCVar17 = pCVar17->pprev) {
    if (ppCVar2 == ppCVar1) {
      pCVar12 = (CBlockIndex *)0x0;
    }
    else {
      pCVar12 = ppCVar2[-1];
    }
    if (pCVar17 == pCVar12) break;
    if (((pCVar17->nStatus & 0x60) != 0) || ((pCVar17->nStatus & 6) == 0)) {
      __assert_fail("pindex->IsValid(BlockStatus::BLOCK_VALID_TREE)",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/chainstate.h"
                    ,99,
                    "bool CreateAndActivateUTXOSnapshot(TestingSetup *, F, bool, bool) [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/chainstate.h:19:27)]"
                   );
    }
    pCVar17->nStatus = 2;
    pCVar17->nTx = 0;
    pCVar17->m_chain_tx_count = 0;
    pCVar17->nSequenceId = 0;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock10.super_unique_lock);
  state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&state_1.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
  state_1.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
  state_1.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
  state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
  _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  state_1.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_local_buf[0] =
       '\0';
  state_1.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
       (pointer)&state_1.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
  state_1.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
  state_1.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] =
       '\0';
  pCVar7 = ChainstateManager::ActiveChainstate
                     ((val->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  local_2c8._0_4_ = 0;
  local_2c8[4] = '\0';
  local_2c8[5] = '\0';
  local_2c8[6] = '\0';
  local_2c8[7] = '\0';
  _Stack_2c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var11._M_pi;
  pblock.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_2c8;
  bVar4 = Chainstate::ActivateBestChain(pCVar7,&state_1,pblock);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_2c0);
  if (bVar4) {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              (&criticalblock10,&cs_main,"node.chainman->GetMutex()",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/chainstate.h"
               ,0x70,false);
    iVar5 = ChainstateManager::ActiveHeight
                      ((val->_M_t).
                       super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                       .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock10.super_unique_lock);
    local_168._M_dataplus._M_p._0_1_ = iVar5 == 0;
    inline_assertion_check<true,bool>
              ((bool *)&local_168,
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/chainstate.h"
               ,0x70,"CreateAndActivateUTXOSnapshot",
               "0 == WITH_LOCK(node.chainman->GetMutex(), return node.chainman->ActiveHeight())");
    ValidationState<BlockValidationResult>::~ValidationState
              (&state_1.super_ValidationState<BlockValidationResult>);
    pCVar7 = ChainstateManager::ActiveChainstate
                       ((val->_M_t).
                        super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                        .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
    ppCVar1 = (pCVar7->m_chain).vChain.
              super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppCVar1 ==
        (pCVar7->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      pCVar17 = (CBlockIndex *)0x0;
    }
    else {
      pCVar17 = ppCVar1[-1];
    }
    if (pCVar17->pprev != (CBlockIndex *)0x0) {
      CChain::SetTip(&pCVar7->m_chain,pCVar17->pprev);
    }
    ChainstateManager::ActivateSnapshot
              ((Result<CBlockIndex_*> *)&state_1,
               (val->_M_t).
               super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>.
               _M_t.
               super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>.
               super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,&local_58,
               (SnapshotMetadata *)&state,false);
    CChain::SetTip(&pCVar7->m_chain,pCVar17);
    std::__detail::__variant::_Variant_storage<false,_bilingual_str,_CBlockIndex_*>::
    ~_Variant_storage((_Variant_storage<false,_bilingual_str,_CBlockIndex_*> *)&state_1);
    std::
    _Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
    ::~_Rb_tree((_Rb_tree<unsigned_short,_unsigned_short,_std::_Identity<unsigned_short>,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
                 *)&state);
    AutoFile::~AutoFile(&local_58);
    UniValue::~UniValue(&result);
    AutoFile::~AutoFile(&local_2a0);
    std::filesystem::__cxx11::path::~path(&snapshot_path.super_path);
    std::filesystem::__cxx11::path::~path(&root.super_path);
    local_340.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (state_1.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf
          [8] == '\x01');
    local_340.m_message.px = (element_type *)0x0;
    local_340.m_message.pn.pi_ = (sp_counted_base *)0x0;
    result._0_8_ = anon_var_dwarf_14c9f42;
    result.val._M_dataplus._M_p = "";
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
         0xffffffffffffff00;
    state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_011481f0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
         (size_type)boost::unit_test::lazy_ostream::inst;
    local_350 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_348 = "";
    pvVar14 = (iterator)0x2;
    pvVar15 = (iterator)0x0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity
         = (size_type)&result;
    boost::test_tools::tt_detail::report_assertion
              (&local_340,(lazy_ostream *)&state,2,0,WARN,
               CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),(size_t)&local_350,0x59
              );
    boost::detail::shared_count::~shared_count(&local_340.m_message.pn);
    local_360 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_358 = "";
    local_370 = &boost::unit_test::basic_cstring<char_const>::null;
    local_368 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x5c;
    file_01.m_begin = (iterator)&local_360;
    msg_01.m_end = pvVar15;
    msg_01.m_begin = pvVar14;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_370,
               msg_01);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&state,&cs_main,"::cs_main",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
               ,0x5c,false);
    bVar4 = ChainstateManager::IsSnapshotActive(this_00);
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&state);
    result.val._M_dataplus._M_p = (pointer)0x0;
    result.val._M_string_length = 0;
    state_1.super_ValidationState<BlockValidationResult>._0_8_ = anon_var_dwarf_14c9f5b;
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p = "";
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
         0xffffffffffffff00;
    state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_011481f0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
         (size_type)boost::unit_test::lazy_ostream::inst;
    local_380 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_378 = "";
    pvVar14 = &DAT_00000001;
    pvVar15 = (iterator)0x0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity
         = (size_type)(_Variant_storage<false,_bilingual_str,_CBlockIndex_*> *)&state_1;
    result.typ._0_1_ = bVar4;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result,(lazy_ostream *)&state,1,0,WARN,
               CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),(size_t)&local_380,0x5c
              );
    boost::detail::shared_count::~shared_count((shared_count *)&result.val._M_string_length);
    curr_tip.super_base_blob<256U>.m_data._M_elems[0] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0];
    curr_tip.super_base_blob<256U>.m_data._M_elems[1] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[1];
    curr_tip.super_base_blob<256U>.m_data._M_elems[2] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[2];
    curr_tip.super_base_blob<256U>.m_data._M_elems[3] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[3];
    curr_tip.super_base_blob<256U>.m_data._M_elems[4] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[4];
    curr_tip.super_base_blob<256U>.m_data._M_elems[5] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[5];
    curr_tip.super_base_blob<256U>.m_data._M_elems[6] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[6];
    curr_tip.super_base_blob<256U>.m_data._M_elems[7] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[7];
    curr_tip.super_base_blob<256U>.m_data._M_elems[8] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[8];
    curr_tip.super_base_blob<256U>.m_data._M_elems[9] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[9];
    curr_tip.super_base_blob<256U>.m_data._M_elems[10] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[10];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0xb] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0xb];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0xc] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0xc];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0xd] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0xd];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0xe] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0xe];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0xf] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0xf];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x10] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x10];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x11] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x11];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x12] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x12];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x13] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x13];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x14] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x14];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x15] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x15];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x16] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x16];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x17] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x17];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x18] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x18];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x19] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x19];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1a] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x1a];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1b] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x1b];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1c] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x1c];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1d] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x1d];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1e] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x1e];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1f] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x1f];
    TestChain100Setup::mineBlocks(&this->super_TestChain100Setup,1);
    local_390 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_388 = "";
    local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_398 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x64;
    file_02.m_begin = (iterator)&local_390;
    msg_02.m_end = pvVar15;
    msg_02.m_begin = pvVar14;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_3a0,
               msg_02);
    result.typ._0_1_ =
         ::operator!=(&g_best_block.super_base_blob<256U>,&curr_tip.super_base_blob<256U>);
    result.val._M_dataplus._M_p = (pointer)0x0;
    result.val._M_string_length = 0;
    state_1.super_ValidationState<BlockValidationResult>._0_8_ = anon_var_dwarf_14c9f29;
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p = "";
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
         0xffffffffffffff00;
    state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_011481f0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
         (size_type)boost::unit_test::lazy_ostream::inst;
    local_3b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_3a8 = "";
    pvVar14 = &DAT_00000001;
    pvVar15 = (iterator)0x0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity
         = (size_type)(_Variant_storage<false,_bilingual_str,_CBlockIndex_*> *)&state_1;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&result,(lazy_ostream *)&state,1,0,WARN,
               CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0),(size_t)&local_3b0,100)
    ;
    boost::detail::shared_count::~shared_count((shared_count *)&result.val._M_string_length);
    curr_tip.super_base_blob<256U>.m_data._M_elems[0] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0];
    curr_tip.super_base_blob<256U>.m_data._M_elems[1] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[1];
    curr_tip.super_base_blob<256U>.m_data._M_elems[2] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[2];
    curr_tip.super_base_blob<256U>.m_data._M_elems[3] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[3];
    curr_tip.super_base_blob<256U>.m_data._M_elems[4] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[4];
    curr_tip.super_base_blob<256U>.m_data._M_elems[5] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[5];
    curr_tip.super_base_blob<256U>.m_data._M_elems[6] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[6];
    curr_tip.super_base_blob<256U>.m_data._M_elems[7] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[7];
    curr_tip.super_base_blob<256U>.m_data._M_elems[8] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[8];
    curr_tip.super_base_blob<256U>.m_data._M_elems[9] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[9];
    curr_tip.super_base_blob<256U>.m_data._M_elems[10] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[10];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0xb] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0xb];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0xc] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0xc];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0xd] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0xd];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0xe] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0xe];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0xf] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0xf];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x10] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x10];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x11] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x11];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x12] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x12];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x13] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x13];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x14] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x14];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x15] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x15];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x16] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x16];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x17] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x17];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x18] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x18];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x19] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x19];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1a] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x1a];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1b] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x1b];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1c] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x1c];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1d] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x1d];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1e] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x1e];
    curr_tip.super_base_blob<256U>.m_data._M_elems[0x1f] =
         g_best_block.super_base_blob<256U>.m_data._M_elems[0x1f];
    local_3c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_3b8 = "";
    local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = &DAT_00000068;
    file_03.m_begin = (iterator)&local_3c0;
    msg_03.m_end = pvVar15;
    msg_03.m_begin = pvVar14;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3d0,
               msg_03);
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p &
         0xffffffffffffff00;
    state.super_ValidationState<BlockValidationResult>._0_8_ = &PTR__lazy_ostream_011480b0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length =
         (size_type)boost::unit_test::lazy_ostream::inst;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity
         = (long)"\x05\x04\x03\x02\x01" + 5;
    local_3e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_3d8 = "";
    ChainstateManager::GetAll
              ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&result,this_00);
    state_1.super_ValidationState<BlockValidationResult>._0_8_ =
         (long)result.val._M_dataplus._M_p - result._0_8_ >> 3;
    root.super_path._M_pathname._M_dataplus._M_p._0_4_ = 2;
    ppVar22 = &root;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&state,&local_3e0,0x68,1,2,&state_1,0xc889c7,(int)ppVar22,"2");
    std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
              ((_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> *)&result);
    ChainstateManager::GetAll((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&state,this_00)
    ;
    _Var3 = state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus;
    plVar18 = (long *)state.super_ValidationState<BlockValidationResult>._0_8_;
    do {
      if (plVar18 == (long *)_Var3._M_p) {
        pCVar7 = (Chainstate *)0x0;
        break;
      }
      pCVar7 = (Chainstate *)*plVar18;
      pCVar9 = ChainstateManager::ActiveChainstate(this_00);
      plVar18 = plVar18 + 1;
    } while (pCVar7 == pCVar9);
    std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
              ((_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> *)&state);
    result._0_8_ = pCVar7;
    ppCVar10 = inline_assertion_check<true,Chainstate*>
                         ((Chainstate **)&result,
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
                          ,0x71,"test_method",
                          "[&]() -> Chainstate* { for (Chainstate* cs : chainman.GetAll()) { if (cs != &chainman.ActiveChainstate()) { return cs; } } return nullptr; }()"
                         );
    pCVar7 = *ppCVar10;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2;
    state.super_ValidationState<BlockValidationResult>.m_mode = M_VALID;
    state.super_ValidationState<BlockValidationResult>.m_result = BLOCK_RESULT_UNSET;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2._M_allocated_capacity
         = state.super_ValidationState<BlockValidationResult>.m_reject_reason.field_2.
           _M_allocated_capacity & 0xffffffffffffff00;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_dataplus._M_p =
         (pointer)&state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2;
    state.super_ValidationState<BlockValidationResult>.m_debug_message._M_string_length = 0;
    state.super_ValidationState<BlockValidationResult>.m_debug_message.field_2._M_local_buf[0] =
         '\0';
    pindex = (CBlockIndex *)0x0;
    consensusParams = Params();
    newblock = false;
    pvVar15 = (iterator)0x0;
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&root,&cs_main,"::cs_main",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
               ,0x7c,false);
    pvVar14 = &DAT_00000001;
    bVar4 = CheckBlock(pblockone.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       &state,&consensusParams->consensus,true,true);
    local_3f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_3e8 = "";
    local_400 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
    local_3f8 = (pointer)&boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x7e;
    file_04.m_begin = (iterator)&local_3f0;
    msg_04.m_end = pvVar15;
    msg_04.m_begin = pvVar14;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_400,
               msg_04);
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)0x0;
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
    snapshot_path.super_path._M_pathname._M_dataplus._M_p = "checked";
    snapshot_path.super_path._M_pathname._M_string_length = (long)"addUnchecked" + 0xc;
    result.val._M_dataplus._M_p = result.val._M_dataplus._M_p & 0xffffffffffffff00;
    result._0_8_ = &PTR__lazy_ostream_011481f0;
    result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    result.val.field_2._M_allocated_capacity = (size_type)&snapshot_path;
    local_410 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_408 = "";
    state_1.super_ValidationState<BlockValidationResult>.m_mode._0_1_ = bVar4;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&state_1,(lazy_ostream *)&result,1,0,WARN,(check_type)ppVar22,
               (size_t)&local_410,0x7e);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &state_1.super_ValidationState<BlockValidationResult>.m_reject_reason.
                _M_string_length);
    uVar19 = (undefined4)((ulong)ppVar22 >> 0x20);
    std::__shared_ptr<CBlock_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<CBlock,void>
              ((__shared_ptr<CBlock_const,(__gnu_cxx::_Lock_policy)2> *)&result,
               &pblockone.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>);
    cVar21 = CHECK_MSG;
    pvVar14 = &DAT_00000001;
    pvVar15 = (iterator)0x0;
    bVar4 = ChainstateManager::AcceptBlock
                      (this_00,(shared_ptr<const_CBlock> *)&result,&state,&pindex,true,
                       (FlatFilePos *)0x0,&newblock,true);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&result.val);
    local_420 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_418 = "";
    local_430 = &boost::unit_test::basic_cstring<char_const>::null;
    local_428 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0x81;
    file_05.m_begin = (iterator)&local_420;
    msg_05.m_end = pvVar15;
    msg_05.m_begin = pvVar14;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_430,
               msg_05);
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)0x0;
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
    snapshot_path.super_path._M_pathname._M_dataplus._M_p = "accepted";
    snapshot_path.super_path._M_pathname._M_string_length = (long)"package accepted" + 0x10;
    result.val._M_dataplus._M_p = result.val._M_dataplus._M_p & 0xffffffffffffff00;
    result._0_8_ = &PTR__lazy_ostream_011481f0;
    result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    result.val.field_2._M_allocated_capacity = (size_type)&snapshot_path;
    local_440 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_438 = "";
    pvVar14 = &DAT_00000001;
    pvVar15 = (iterator)0x0;
    _Var11._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x81;
    state_1.super_ValidationState<BlockValidationResult>.m_mode._0_1_ = bVar4;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&state_1,(lazy_ostream *)&result,1,0,WARN,CONCAT44(uVar19,cVar21)
               ,(size_t)&local_440,0x81);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &state_1.super_ValidationState<BlockValidationResult>.m_reject_reason.
                _M_string_length);
    std::unique_lock<std::recursive_mutex>::~unique_lock((unique_lock<std::recursive_mutex> *)&root)
    ;
    std::__shared_ptr<CBlock_const,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<CBlock,void>
              ((__shared_ptr<CBlock_const,(__gnu_cxx::_Lock_policy)2> *)local_450,
               &pblockone.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>);
    pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var11._M_pi;
    pblock_00.super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_450;
    bVar4 = Chainstate::ActivateBestChain(pCVar7,&state,pblock_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_450 + 8));
    local_460 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_458 = "";
    local_470 = &boost::unit_test::basic_cstring<char_const>::null;
    local_468 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0x88;
    file_06.m_begin = (iterator)&local_460;
    msg_06.m_end = pvVar15;
    msg_06.m_begin = pvVar14;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_470,
               msg_06);
    result.val._M_dataplus._M_p = result.val._M_dataplus._M_p & 0xffffffffffffff00;
    result._0_8_ = &PTR__lazy_ostream_011480b0;
    result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    result.val.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
    local_480 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_478 = "";
    CBlockIndex::GetBlockHash
              ((uint256 *)&state_1,
               (pCVar7->m_chain).vChain.
               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
               super__Vector_impl_data._M_finish[-1]);
    CBlockHeader::GetHash
              ((uint256 *)&root,
               &(pblockone.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_CBlockHeader);
    pvVar14 = (iterator)0x2;
    pBVar16 = &state_1;
    ppVar22 = &root;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (&result,&local_480,0x88,1,2,pBVar16,0xc88a6f,(int)&root,"pblockone->GetHash()");
    local_490 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_488 = "";
    local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_498 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0x8c;
    file_07.m_begin = (iterator)&local_490;
    msg_07.m_end = (iterator)pBVar16;
    msg_07.m_begin = pvVar14;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_4a0,
               msg_07);
    state_1.super_ValidationState<BlockValidationResult>.m_mode._0_1_ = bVar4;
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_dataplus._M_p =
         (pointer)0x0;
    state_1.super_ValidationState<BlockValidationResult>.m_reject_reason._M_string_length = 0;
    root.super_path._M_pathname._M_dataplus._M_p = "block_added";
    root.super_path._M_pathname._M_string_length = (long)"block_added" + 0xb;
    result.val._M_dataplus._M_p = result.val._M_dataplus._M_p & 0xffffffffffffff00;
    result._0_8_ = &PTR__lazy_ostream_011481f0;
    result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    local_4b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_4a8 = "";
    pvVar14 = &DAT_00000001;
    pvVar15 = (iterator)0x0;
    result.val.field_2._M_allocated_capacity = (size_type)&root;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&state_1,(lazy_ostream *)&result,1,0,WARN,(check_type)ppVar22,
               (size_t)&local_4b0,0x8c);
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &state_1.super_ValidationState<BlockValidationResult>.m_reject_reason.
                _M_string_length);
    local_4c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_4b8 = "";
    local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_08.m_end = (iterator)0x8d;
    file_08.m_begin = (iterator)&local_4c0;
    msg_08.m_end = pvVar15;
    msg_08.m_begin = pvVar14;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_4d0,
               msg_08);
    result.val._M_dataplus._M_p = result.val._M_dataplus._M_p & 0xffffffffffffff00;
    result._0_8_ = &PTR__lazy_ostream_011480b0;
    result.val._M_string_length = (size_type)boost::unit_test::lazy_ostream::inst;
    result.val.field_2._M_allocated_capacity = (long)"\x05\x04\x03\x02\x01" + 5;
    local_4e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/validation_chainstate_tests.cpp"
    ;
    local_4d8 = "";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,uint256,uint256>
              (&result,&local_4e0,0x8d,1,2,&curr_tip,0xc88867,0x116deb8,"::g_best_block");
    ValidationState<BlockValidationResult>::~ValidationState
              (&state.super_ValidationState<BlockValidationResult>);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&pblockone.super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    ValidationState<BlockValidationResult>::ToString_abi_cxx11_
              (&local_168,&state_1.super_ValidationState<BlockValidationResult>);
    tinyformat::format<std::__cxx11::string>
              ((string *)&criticalblock10,(tinyformat *)"ActivateBestChain failed. (%s)",
               (char *)&local_168,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var11._M_pi);
    std::runtime_error::runtime_error(this_02,(string *)&criticalblock10);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(chainstate_update_tip, TestChain100Setup)
{
    ChainstateManager& chainman = *Assert(m_node.chainman);
    uint256 curr_tip = ::g_best_block;

    // Mine 10 more blocks, putting at us height 110 where a valid assumeutxo value can
    // be found.
    mineBlocks(10);

    // After adding some blocks to the tip, best block should have changed.
    BOOST_CHECK(::g_best_block != curr_tip);

    // Grab block 1 from disk; we'll add it to the background chain later.
    std::shared_ptr<CBlock> pblockone = std::make_shared<CBlock>();
    {
        LOCK(::cs_main);
        chainman.m_blockman.ReadBlockFromDisk(*pblockone, *chainman.ActiveChain()[1]);
    }

    BOOST_REQUIRE(CreateAndActivateUTXOSnapshot(
        this, NoMalleation, /*reset_chainstate=*/ true));

    // Ensure our active chain is the snapshot chainstate.
    BOOST_CHECK(WITH_LOCK(::cs_main, return chainman.IsSnapshotActive()));

    curr_tip = ::g_best_block;

    // Mine a new block on top of the activated snapshot chainstate.
    mineBlocks(1);  // Defined in TestChain100Setup.

    // After adding some blocks to the snapshot tip, best block should have changed.
    BOOST_CHECK(::g_best_block != curr_tip);

    curr_tip = ::g_best_block;

    BOOST_CHECK_EQUAL(chainman.GetAll().size(), 2);

    Chainstate& background_cs{*Assert([&]() -> Chainstate* {
        for (Chainstate* cs : chainman.GetAll()) {
            if (cs != &chainman.ActiveChainstate()) {
                return cs;
            }
        }
        return nullptr;
    }())};

    // Append the first block to the background chain.
    BlockValidationState state;
    CBlockIndex* pindex = nullptr;
    const CChainParams& chainparams = Params();
    bool newblock = false;

    // TODO: much of this is inlined from ProcessNewBlock(); just reuse PNB()
    // once it is changed to support multiple chainstates.
    {
        LOCK(::cs_main);
        bool checked = CheckBlock(*pblockone, state, chainparams.GetConsensus());
        BOOST_CHECK(checked);
        bool accepted = chainman.AcceptBlock(
            pblockone, state, &pindex, true, nullptr, &newblock, true);
        BOOST_CHECK(accepted);
    }

    // UpdateTip is called here
    bool block_added = background_cs.ActivateBestChain(state, pblockone);

    // Ensure tip is as expected
    BOOST_CHECK_EQUAL(background_cs.m_chain.Tip()->GetBlockHash(), pblockone->GetHash());

    // g_best_block should be unchanged after adding a block to the background
    // validation chain.
    BOOST_CHECK(block_added);
    BOOST_CHECK_EQUAL(curr_tip, ::g_best_block);
}